

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_4x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  int8_t *piVar3;
  int iVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  __m128i *in_00;
  __m128i in [8];
  
  piVar3 = av1_fwd_txfm_shift_ls[5];
  iVar4 = (int)CONCAT71(in_register_00000009,tx_type);
  uVar7 = iVar4 - 4;
  uVar5 = (ulong)(uint)(iVar4 << 3);
  pcVar1 = *(code **)((long)col_highbd_txfm4x8_arr + uVar5);
  iVar4 = 0;
  uVar6 = 0;
  if ((byte)uVar7 < 0xc) {
    uVar7 = (uVar7 & 0xff) << 2;
    iVar4 = *(int *)(&DAT_004c2c9c + uVar7);
    uVar6 = (ulong)*(uint *)(&DAT_004c2ccc + uVar7);
  }
  pcVar2 = *(code **)((long)row_highbd_txfm4x4_arr + uVar5);
  load_buffer_4x8(input,in,stride,iVar4,(int)uVar6,(int)*av1_fwd_txfm_shift_ls[5]);
  (*pcVar1)(in,in,0xd,1);
  col_txfm_4x8_rounding(in,-(int)piVar3[1]);
  for (lVar8 = 0; lVar8 != 0x80; lVar8 = lVar8 + 0x40) {
    in_00 = (__m128i *)((long)in[0] + lVar8);
    transpose_32bit_4x4(in_00,in_00);
    (*pcVar2)(in_00,in_00,0xd,1);
    iVar4 = -(int)piVar3[2];
    av1_round_shift_rect_array_32_sse4_1(in_00,in_00,4,iVar4,(int)uVar6);
    store_output_w4(coeff,in_00,8,iVar4);
    coeff = coeff + 4;
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_4x8_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X8];
  const int txw_idx = get_txw_idx(TX_4X8);
  const int txh_idx = get_txh_idx(TX_4X8);
  const int txfm_size_col = tx_size_wide[TX_4X8];
  const int txfm_size_row = tx_size_high[TX_4X8];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x4_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_4x8(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, in, bitcol, 1);
  col_txfm_4x8_rounding(in, -shift[1]);

  for (int i = 0; i < 2; i++) {
    __m128i *cur_in = &in[i * 4];
    transpose_32bit_4x4(cur_in, cur_in);
    row_txfm(cur_in, cur_in, bitrow, 1);
    av1_round_shift_rect_array_32_sse4_1(cur_in, cur_in, txfm_size_col,
                                         -shift[2], NewSqrt2);
    store_output_w4(coeff + i * 4, cur_in, txfm_size_row, 4);
  }
  (void)bd;
}